

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O0

void __thiscall
crnlib::clusterizer<crnlib::vec<2U,_float>_>::add_training_vec
          (clusterizer<crnlib::vec<2U,_float>_> *this,vec<2U,_float> *v,uint weight)

{
  undefined4 in_EDX;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *in_RDI;
  vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_> *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  
  std::make_pair<crnlib::vec<2u,float>const&,unsigned_int&>
            ((vec<2U,_float> *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
             (uint *)in_stack_ffffffffffffffe0);
  vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_>::push_back
            (in_stack_ffffffffffffffe0,in_RDI);
  return;
}

Assistant:

void add_training_vec(const VectorType& v, uint weight) {
    m_training_vecs.push_back(std::make_pair(v, weight));
  }